

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O3

int nn_xsurveyor_events(nn_sockbase *self)

{
  int iVar1;
  
  iVar1 = nn_fq_can_recv((nn_fq *)&self[2].sock);
  return 3 - (uint)(iVar1 == 0);
}

Assistant:

int nn_xsurveyor_events (struct nn_sockbase *self)
{
    struct nn_xsurveyor *xsurveyor;
    int events;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);

    events = NN_SOCKBASE_EVENT_OUT;
    if (nn_fq_can_recv (&xsurveyor->inpipes))
        events |= NN_SOCKBASE_EVENT_IN;
    return events;
}